

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

bool __thiscall
cmCTestRunTest::EndTest(cmCTestRunTest *this,size_t completed,size_t total,bool started)

{
  string *psVar1;
  double dVar2;
  int iVar3;
  cmCTest *pcVar4;
  cmCTestTestHandler *this_00;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  pointer ppVar9;
  cmCTestTestProperties *pcVar10;
  ostream *poVar11;
  cmProcess *pcVar12;
  size_t sVar13;
  char *pcVar14;
  char cVar15;
  char *pcVar16;
  pointer ppVar17;
  string local_5f8;
  string reason;
  ostringstream cmCTestLog_msg;
  char buf [1024];
  
  bVar6 = this->TestHandler->MemCheck;
  if ((bool)bVar6 == false) {
    bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest);
    if (!bVar5) {
      bVar6 = this->TestHandler->MemCheck;
      goto LAB_00348b3b;
    }
LAB_00348b4c:
    CompressOutput(this);
  }
  else {
LAB_00348b3b:
    if (((bVar6 & 1) != 0) && (bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest), bVar5))
    goto LAB_00348b4c;
  }
  WriteLogOutputTop(this,completed,total);
  reason._M_dataplus._M_p = (pointer)&reason.field_2;
  reason._M_string_length = 0;
  reason.field_2._M_local_buf[0] = '\0';
  if (started) {
    iVar8 = cmProcess::GetProcessStatus(this->TestProcess);
  }
  else {
    iVar8 = 1;
  }
  pcVar10 = this->TestProperties;
  iVar3 = this->TestProcess->ExitValue;
  ppVar17 = (pcVar10->RequiredRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar13 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar13 == 0 &&
      ppVar17 !=
      (pcVar10->RequiredRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      bVar5 = ppVar17 ==
              (this->TestProperties->RequiredRegularExpressions).
              super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar5) break;
      bVar7 = cmsys::RegularExpression::find(&ppVar17->first,(this->ProcessOutput)._M_dataplus._M_p)
      ;
      ppVar17 = ppVar17 + 1;
    } while (!bVar7);
    std::__cxx11::string::assign((char *)&reason);
    std::__cxx11::string::append((char *)&reason);
    pcVar10 = this->TestProperties;
    for (ppVar17 = (pcVar10->RequiredRegularExpressions).
                   super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppVar17 !=
        (pcVar10->RequiredRegularExpressions).
        super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppVar17 = ppVar17 + 1) {
      std::__cxx11::string::append((string *)&reason);
      std::__cxx11::string::append((char *)&reason);
      pcVar10 = this->TestProperties;
    }
    std::__cxx11::string::append((char *)&reason);
    pcVar10 = this->TestProperties;
    sVar13 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    bVar5 = false;
  }
  ppVar17 = (pcVar10->ErrorRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = (pcVar10->ErrorRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((ppVar17 != ppVar9) && (sVar13 == 0)) {
    for (; ppVar17 != ppVar9; ppVar17 = ppVar17 + 1) {
      bVar7 = cmsys::RegularExpression::find(&ppVar17->first,(this->ProcessOutput)._M_dataplus._M_p)
      ;
      if (bVar7) {
        std::__cxx11::string::assign((char *)&reason);
        std::__cxx11::string::append((char *)&reason);
        std::__cxx11::string::append((string *)&reason);
        bVar5 = true;
        std::__cxx11::string::append((char *)&reason);
        break;
      }
      ppVar9 = (this->TestProperties->ErrorRegularExpressions).
               super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  if (iVar8 == 2) {
    cVar15 = this->CTest->OutputTestOutputOnTestFailure;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
    std::operator<<((ostream *)buf,"***Exception: ");
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xef,_cmCTestLog_msg,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
    cmProcess::GetExitExceptionString_abi_cxx11_((string *)buf,this->TestProcess);
    psVar1 = &(this->TestResult).ExceptionStatus;
    std::__cxx11::string::operator=((string *)psVar1,(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    iVar8 = cmProcess::GetExitException(this->TestProcess);
    switch(iVar8) {
    case 1:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,"SegFault");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf4,_cmCTestLog_msg,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
      (this->TestResult).Status = 2;
      break;
    case 2:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,"Illegal");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf8,_cmCTestLog_msg,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
      (this->TestResult).Status = 3;
      break;
    case 3:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,"Interrupt");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xfc,_cmCTestLog_msg,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
      (this->TestResult).Status = 4;
      break;
    case 4:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,"Numerical");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x100,_cmCTestLog_msg,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
      (this->TestResult).Status = 5;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,(string *)psVar1);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x105,_cmCTestLog_msg,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
      (this->TestResult).Status = 6;
    }
  }
  else if (iVar8 == 5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
    std::operator<<((ostream *)buf,"***Timeout ");
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xea,_cmCTestLog_msg,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
    (this->TestResult).Status = 1;
LAB_00348db8:
    cVar15 = this->CTest->OutputTestOutputOnTestFailure;
  }
  else {
    if (iVar8 == 4) {
      if (bVar5) {
        pcVar10 = this->TestProperties;
        bVar5 = false;
      }
      else {
        pcVar10 = this->TestProperties;
        if (iVar3 == 0) {
          bVar5 = true;
        }
        else {
          bVar5 = (pcVar10->RequiredRegularExpressions).
                  super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pcVar10->RequiredRegularExpressions).
                  super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      if (pcVar10->SkipReturnCode == iVar3 && -1 < pcVar10->SkipReturnCode) {
        (this->TestResult).Status = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
        poVar11 = std::operator<<((ostream *)buf,"SKIP_RETURN_CODE=");
        std::ostream::operator<<(poVar11,this->TestProperties->SkipReturnCode);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).CompletionStatus,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator<<((ostream *)&cmCTestLog_msg,"***Skipped ");
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0xde,local_5f8._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
        bVar6 = 1;
        cVar15 = '\0';
        goto LAB_00349374;
      }
      if (bVar5 == pcVar10->WillFail) {
        (this->TestResult).Status = 7;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
        poVar11 = std::operator<<((ostream *)buf,"***Failed  ");
        std::operator<<(poVar11,(string *)&reason);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0xe6,_cmCTestLog_msg,false);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
        goto LAB_00348db8;
      }
      (this->TestResult).Status = 9;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,"   Passed  ");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xe3,_cmCTestLog_msg,false);
    }
    else {
      bVar5 = std::operator==("Disabled",&(this->TestResult).CompletionStatus);
      if (bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
        std::operator<<((ostream *)buf,"***Not Run (Disabled) ");
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x109,_cmCTestLog_msg,false);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
        std::operator<<((ostream *)buf,"***Not Run ");
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x10c,_cmCTestLog_msg,false);
      }
    }
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
    cVar15 = '\0';
  }
  bVar6 = 0;
LAB_00349374:
  iVar8 = (this->TestResult).Status;
  sprintf(buf,"%6.2f sec",this->TestProcess->TotalTime);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,buf);
  std::operator<<(poVar11,"\n");
  pcVar4 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x112,local_5f8._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if (cVar15 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&this->ProcessOutput);
    std::endl<char,std::char_traits<char>>(poVar11);
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x115,local_5f8._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  poVar11 = this->TestHandler->LogFile;
  if (poVar11 != (ostream *)0x0) {
    poVar11 = std::operator<<(poVar11,"Test time = ");
    poVar11 = std::operator<<(poVar11,buf);
    std::endl<char,std::char_traits<char>>(poVar11);
  }
  cmWorkingDirectory::cmWorkingDirectory
            ((cmWorkingDirectory *)&cmCTestLog_msg,&this->TestProperties->Directory);
  DartProcessing(this);
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)&cmCTestLog_msg);
  if ((started) && (this_00 = this->TestHandler, this_00->MemCheck == false)) {
    cmCTestTestHandler::CleanTestOutput
              (this_00,&this->ProcessOutput,
               (long)(&this_00->CustomMaximumPassedTestOutputSize)[(this->TestResult).Status != 9]);
  }
  psVar1 = &(this->TestResult).Reason;
  std::__cxx11::string::_M_assign((string *)psVar1);
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    iVar3 = (this->TestResult).Status;
    pcVar16 = "Test Pass Reason";
    pcVar14 = "Test Passed.\n";
    if ((iVar3 != 0) && (iVar3 != 9)) {
      pcVar16 = "Test Fail Reason";
      pcVar14 = "Test Failed.\n";
    }
    dVar2 = this->TestProcess->TotalTime;
    sprintf((char *)&cmCTestLog_msg,"%02d:%02d:%02d",(ulong)(uint)(int)(dVar2 / 3600.0),
            (long)(int)(dVar2 / 60.0) % 0x3c & 0xffffffff,(long)(int)dVar2 % 0x3c & 0xffffffff);
    poVar11 = std::operator<<(this->TestHandler->LogFile,
                              "----------------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar11);
    poVar11 = this->TestHandler->LogFile;
    if ((this->TestResult).Reason._M_string_length != 0) {
      poVar11 = std::operator<<(poVar11,pcVar16);
      poVar11 = std::operator<<(poVar11,":\n");
      poVar11 = std::operator<<(poVar11,(string *)psVar1);
      pcVar14 = "\n";
    }
    std::operator<<(poVar11,pcVar14);
    poVar11 = std::operator<<(this->TestHandler->LogFile,"\"");
    poVar11 = std::operator<<(poVar11,(string *)this->TestProperties);
    poVar11 = std::operator<<(poVar11,"\" end time: ");
    cmCTest::CurrentTime_abi_cxx11_(&local_5f8,this->CTest);
    poVar11 = std::operator<<(poVar11,(string *)&local_5f8);
    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
    poVar11 = std::operator<<(poVar11,"\"");
    poVar11 = std::operator<<(poVar11,(string *)this->TestProperties);
    poVar11 = std::operator<<(poVar11,"\" time elapsed: ");
    poVar11 = std::operator<<(poVar11,(char *)&cmCTestLog_msg);
    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
    poVar11 = std::operator<<(poVar11,"----------------------------------------------------------");
    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::~string((string *)&local_5f8);
  }
  if (started) {
    bVar5 = false;
    if ((this->TestHandler->MemCheck == false) &&
       (bVar5 = false, this->CompressionRatio <= 1.0 && this->CompressionRatio != 1.0)) {
      bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest);
    }
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).CompressOutput = bVar5;
    pcVar12 = this->TestProcess;
    (this->TestResult).ReturnValue = pcVar12->ExitValue;
    if (bVar6 == 0) {
      std::__cxx11::string::assign((char *)&(this->TestResult).CompletionStatus);
      pcVar12 = this->TestProcess;
    }
    (this->TestResult).ExecutionTime = pcVar12->TotalTime;
    MemCheckPostProcess(this);
    ComputeWeightedCost(this);
  }
  bVar5 = NeedsToRerun(this);
  if (!bVar5) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::push_back(&this->TestHandler->TestResults,&this->TestResult);
  }
  pcVar12 = this->TestProcess;
  if (pcVar12 != (cmProcess *)0x0) {
    cmProcess::~cmProcess(pcVar12);
  }
  operator_delete(pcVar12,0xc0);
  std::__cxx11::string::~string((string *)&reason);
  return (bool)(bVar6 | iVar8 == 9);
}

Assistant:

bool cmCTestRunTest::EndTest(size_t completed, size_t total, bool started)
{
  if ((!this->TestHandler->MemCheck &&
       this->CTest->ShouldCompressTestOutput()) ||
      (this->TestHandler->MemCheck &&
       this->CTest->ShouldCompressTestOutput())) {
    this->CompressOutput();
  }

  this->WriteLogOutputTop(completed, total);
  std::string reason;
  bool passed = true;
  int res =
    started ? this->TestProcess->GetProcessStatus() : cmsysProcess_State_Error;
  int retVal = this->TestProcess->GetExitValue();
  std::vector<std::pair<cmsys::RegularExpression, std::string> >::iterator
    passIt;
  bool forceFail = false;
  bool skipped = false;
  bool outputTestErrorsToConsole = false;
  if (!this->TestProperties->RequiredRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    bool found = false;
    for (passIt = this->TestProperties->RequiredRegularExpressions.begin();
         passIt != this->TestProperties->RequiredRegularExpressions.end();
         ++passIt) {
      if (passIt->first.find(this->ProcessOutput.c_str())) {
        found = true;
        reason = "Required regular expression found.";
        break;
      }
    }
    if (!found) {
      reason = "Required regular expression not found.";
      forceFail = true;
    }
    reason += "Regex=[";
    for (passIt = this->TestProperties->RequiredRegularExpressions.begin();
         passIt != this->TestProperties->RequiredRegularExpressions.end();
         ++passIt) {
      reason += passIt->second;
      reason += "\n";
    }
    reason += "]";
  }
  if (!this->TestProperties->ErrorRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (passIt = this->TestProperties->ErrorRegularExpressions.begin();
         passIt != this->TestProperties->ErrorRegularExpressions.end();
         ++passIt) {
      if (passIt->first.find(this->ProcessOutput.c_str())) {
        reason = "Error regular expression found in output.";
        reason += " Regex=[";
        reason += passIt->second;
        reason += "]";
        forceFail = true;
        break;
      }
    }
  }
  if (res == cmsysProcess_State_Exited) {
    bool success = !forceFail &&
      (retVal == 0 ||
       !this->TestProperties->RequiredRegularExpressions.empty());
    if (this->TestProperties->SkipReturnCode >= 0 &&
        this->TestProperties->SkipReturnCode == retVal) {
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      std::ostringstream s;
      s << "SKIP_RETURN_CODE=" << this->TestProperties->SkipReturnCode;
      this->TestResult.CompletionStatus = s.str();
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Skipped ");
      skipped = true;
    } else if ((success && !this->TestProperties->WillFail) ||
               (!success && this->TestProperties->WillFail)) {
      this->TestResult.Status = cmCTestTestHandler::COMPLETED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "   Passed  ");
    } else {
      this->TestResult.Status = cmCTestTestHandler::FAILED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Failed  " << reason);
      outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    }
  } else if (res == cmsysProcess_State_Expired) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Timeout ");
    this->TestResult.Status = cmCTestTestHandler::TIMEOUT;
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
  } else if (res == cmsysProcess_State_Exception) {
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Exception: ");
    this->TestResult.ExceptionStatus =
      this->TestProcess->GetExitExceptionString();
    switch (this->TestProcess->GetExitException()) {
      case cmsysProcess_Exception_Fault:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "SegFault");
        this->TestResult.Status = cmCTestTestHandler::SEGFAULT;
        break;
      case cmsysProcess_Exception_Illegal:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Illegal");
        this->TestResult.Status = cmCTestTestHandler::ILLEGAL;
        break;
      case cmsysProcess_Exception_Interrupt:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Interrupt");
        this->TestResult.Status = cmCTestTestHandler::INTERRUPT;
        break;
      case cmsysProcess_Exception_Numerical:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Numerical");
        this->TestResult.Status = cmCTestTestHandler::NUMERICAL;
        break;
      default:
        cmCTestLog(this->CTest, HANDLER_OUTPUT,
                   this->TestResult.ExceptionStatus);
        this->TestResult.Status = cmCTestTestHandler::OTHER_FAULT;
    }
  } else if ("Disabled" == this->TestResult.CompletionStatus) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Not Run (Disabled) ");
  } else // cmsysProcess_State_Error
  {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Not Run ");
  }

  passed = this->TestResult.Status == cmCTestTestHandler::COMPLETED;
  char buf[1024];
  sprintf(buf, "%6.2f sec", this->TestProcess->GetTotalTime());
  cmCTestLog(this->CTest, HANDLER_OUTPUT, buf << "\n");

  if (outputTestErrorsToConsole) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, this->ProcessOutput << std::endl);
  }

  if (this->TestHandler->LogFile) {
    *this->TestHandler->LogFile << "Test time = " << buf << std::endl;
  }

  // Set the working directory to the tests directory to process Dart files.
  {
    cmWorkingDirectory workdir(this->TestProperties->Directory);
    this->DartProcessing();
  }

  // if this is doing MemCheck then all the output needs to be put into
  // Output since that is what is parsed by cmCTestMemCheckHandler
  if (!this->TestHandler->MemCheck && started) {
    this->TestHandler->CleanTestOutput(
      this->ProcessOutput,
      static_cast<size_t>(
        this->TestResult.Status == cmCTestTestHandler::COMPLETED
          ? this->TestHandler->CustomMaximumPassedTestOutputSize
          : this->TestHandler->CustomMaximumFailedTestOutputSize));
  }
  this->TestResult.Reason = reason;
  if (this->TestHandler->LogFile) {
    bool pass = true;
    const char* reasonType = "Test Pass Reason";
    if (this->TestResult.Status != cmCTestTestHandler::COMPLETED &&
        this->TestResult.Status != cmCTestTestHandler::NOT_RUN) {
      reasonType = "Test Fail Reason";
      pass = false;
    }
    double ttime = this->TestProcess->GetTotalTime();
    int hours = static_cast<int>(ttime / (60 * 60));
    int minutes = static_cast<int>(ttime / 60) % 60;
    int seconds = static_cast<int>(ttime) % 60;
    char buffer[100];
    sprintf(buffer, "%02d:%02d:%02d", hours, minutes, seconds);
    *this->TestHandler->LogFile
      << "----------------------------------------------------------"
      << std::endl;
    if (!this->TestResult.Reason.empty()) {
      *this->TestHandler->LogFile << reasonType << ":\n"
                                  << this->TestResult.Reason << "\n";
    } else {
      if (pass) {
        *this->TestHandler->LogFile << "Test Passed.\n";
      } else {
        *this->TestHandler->LogFile << "Test Failed.\n";
      }
    }
    *this->TestHandler->LogFile
      << "\"" << this->TestProperties->Name
      << "\" end time: " << this->CTest->CurrentTime() << std::endl
      << "\"" << this->TestProperties->Name << "\" time elapsed: " << buffer
      << std::endl
      << "----------------------------------------------------------"
      << std::endl
      << std::endl;
  }
  // if the test actually started and ran
  // record the results in TestResult
  if (started) {
    bool compress = !this->TestHandler->MemCheck &&
      this->CompressionRatio < 1 && this->CTest->ShouldCompressTestOutput();
    this->TestResult.Output =
      compress ? this->CompressedOutput : this->ProcessOutput;
    this->TestResult.CompressOutput = compress;
    this->TestResult.ReturnValue = this->TestProcess->GetExitValue();
    if (!skipped) {
      this->TestResult.CompletionStatus = "Completed";
    }
    this->TestResult.ExecutionTime = this->TestProcess->GetTotalTime();
    this->MemCheckPostProcess();
    this->ComputeWeightedCost();
  }
  // If the test does not need to rerun push the current TestResult onto the
  // TestHandler vector
  if (!this->NeedsToRerun()) {
    this->TestHandler->TestResults.push_back(this->TestResult);
  }
  delete this->TestProcess;
  return passed || skipped;
}